

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  list<int,_std::allocator<int>_> *end;
  _List_node_base *p_Var1;
  ostream *poVar2;
  int iVar3;
  int m;
  bool bVar4;
  params arguments;
  solution sol;
  params local_170;
  solution local_148;
  
  params::params(&local_170,argc,argv);
  if (local_170.help_required == true) {
    poVar2 = operator<<((ostream *)&std::cout,(help_type *)&params::help);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    end = &local_170.capacities;
    if (local_170.measure == 0) {
      iVar3 = 0;
      for (p_Var1 = local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node
                    .super__List_node_base._M_next; p_Var1 != (_List_node_base *)end;
          p_Var1 = p_Var1->_M_next) {
        iVar3 = iVar3 + *(int *)&p_Var1[1]._M_next;
      }
      solution::solution<std::_List_const_iterator<int>>
                (&local_148,
                 (_List_const_iterator<int>)
                 local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                 super__List_node_base._M_next,(_List_const_iterator<int>)end);
      if (0 < iVar3) {
        m = 1;
        do {
          solution::find_solution(&local_148,m,local_170.max_steps);
          poVar2 = operator<<((ostream *)&std::cout,&local_148);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          bVar4 = m != iVar3;
          m = m + 1;
        } while (bVar4);
      }
    }
    else {
      solution::solution<std::_List_const_iterator<int>>
                (&local_148,
                 (_List_const_iterator<int>)
                 local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                 super__List_node_base._M_next,(_List_const_iterator<int>)end);
      solution::find_solution(&local_148,local_170.measure,local_170.max_steps);
      poVar2 = operator<<((ostream *)&std::cout,&local_148);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
              (&local_148.steps_ixes.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Deque_base<step,_std::allocator<step>_>::~_Deque_base
              (&local_148.current_steps.super__Deque_base<step,_std::allocator<step>_>);
    std::_Deque_base<step,_std::allocator<step>_>::~_Deque_base
              (&local_148.possible_steps.super__Deque_base<step,_std::allocator<step>_>);
    std::vector<bucket,_std::allocator<bucket>_>::~vector(&local_148.buckets);
  }
  while (local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&local_170.capacities) {
    p_Var1 = (local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
              super__List_node_base._M_next)->_M_next;
    operator_delete(local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node
                    .super__List_node_base._M_next,0x18);
    local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var1;
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	int rc = EXIT_SUCCESS;

	try {
		const params arguments{argc, argv};
		if (arguments.help_required)
			std::cout << params::help << std::endl;
		else
			find_solutions(arguments);
	}
	catch (const std::exception& e) {
		std::cerr << "\nError: " << e.what() << std::endl;
		rc = EXIT_FAILURE;
	}

	return rc;
}